

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createBXor(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  bool bVar1;
  bool bVar2;
  LiteralType LVar3;
  ConstantBoolean *pCVar4;
  ConstantValue<bool,_(flow::LiteralType)1> *local_98;
  ConstantBoolean *local_88;
  string local_60;
  ConstantValue<bool,_(flow::LiteralType)1> *local_40;
  ConstantBoolean *b;
  ConstantBoolean *a;
  string *name_local;
  Value *rhs_local;
  Value *lhs_local;
  IRBuilder *this_local;
  
  a = (ConstantBoolean *)name;
  name_local = (string *)rhs;
  rhs_local = lhs;
  lhs_local = (Value *)this;
  LVar3 = Value::type(rhs);
  if (LVar3 != Boolean) {
    __assert_fail("rhs->type() == LiteralType::Boolean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x9e,"Value *flow::IRBuilder::createBXor(Value *, Value *, const std::string &)")
    ;
  }
  if (rhs_local == (Value *)0x0) {
    local_88 = (ConstantBoolean *)0x0;
  }
  else {
    local_88 = (ConstantBoolean *)
               __dynamic_cast(rhs_local,&Value::typeinfo,
                              &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
  }
  b = local_88;
  if (local_88 != (ConstantBoolean *)0x0) {
    if (name_local == (string *)0x0) {
      local_98 = (ConstantValue<bool,_(flow::LiteralType)1> *)0x0;
    }
    else {
      local_98 = (ConstantValue<bool,_(flow::LiteralType)1> *)
                 __dynamic_cast(name_local,&Value::typeinfo,
                                &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
    }
    local_40 = local_98;
    if (local_98 != (ConstantValue<bool,_(flow::LiteralType)1> *)0x0) {
      bVar1 = ConstantValue<bool,_(flow::LiteralType)1>::get(b);
      bVar2 = ConstantValue<bool,_(flow::LiteralType)1>::get(local_40);
      pCVar4 = getBoolean(this,bVar1 != bVar2);
      return (Value *)pCVar4;
    }
  }
  makeName(&local_60,this,(string *)a);
  this_local = (IRBuilder *)
               insert<flow::BinaryInstr<(flow::BinaryOperator)17,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                         (this,&rhs_local,(Value **)&name_local,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return (Value *)this_local;
}

Assistant:

Value* IRBuilder::createBXor(Value* lhs, Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Boolean);

  if (auto a = dynamic_cast<ConstantBoolean*>(lhs))
    if (auto b = dynamic_cast<ConstantBoolean*>(rhs))
      return getBoolean(a->get() ^ b->get());

  return insert<BAndInstr>(lhs, rhs, makeName(name));
}